

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.cpp
# Opt level: O2

void __thiscall FMapInfoParser::ParseGameInfo(FMapInfoParser *this)

{
  FString __s1;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  staticgameborder_t *other;
  FString *this_00;
  FName *this_01;
  long lVar6;
  char *pcVar7;
  FString colorName;
  FString color;
  FString nextKey;
  
  FScanner::MustGetToken(&this->sc,0x7b);
  do {
    bVar1 = FScanner::GetToken(&this->sc);
    if ((!bVar1) || ((this->sc).TokenType == 0x7d)) {
      return;
    }
    FScanner::TokenMustBe(&this->sc,0x101);
    FString::FString(&nextKey,(this->sc).String);
    FScanner::MustGetToken(&this->sc,0x3d);
    __s1 = nextKey;
    iVar2 = strcasecmp(nextKey.Chars,"weaponslot");
    if (iVar2 == 0) {
      FScanner::MustGetToken(&this->sc,0x104);
      uVar3 = (this->sc).Number;
      if (9 < uVar3) {
        FScanner::ScriptError(&this->sc,"Weapon slot index must be in range [0..9].\n");
        uVar3 = (this->sc).Number;
      }
      TArray<FName,_FName>::Clear(gameinfo.DefaultWeaponSlots + (int)uVar3);
      FScanner::MustGetToken(&this->sc,0x2c);
      do {
        FScanner::MustGetString(&this->sc);
        FName::FName((FName *)&color,(this->sc).String);
        TArray<FName,_FName>::Push(gameinfo.DefaultWeaponSlots + (int)uVar3,(FName *)&color);
        bVar1 = FScanner::CheckToken(&this->sc,0x2c);
      } while (bVar1);
    }
    else {
      iVar2 = strcasecmp(__s1.Chars,"border");
      if (iVar2 == 0) {
        bVar1 = FScanner::CheckToken(&this->sc,0x101);
        if (bVar1) {
          iVar2 = FScanner::MustMatchString(&this->sc,GameInfoBorders,8);
          other = &DoomBorder;
          if (iVar2 == 2) {
            other = &StrifeBorder;
          }
          if (iVar2 == 1) {
            other = &HereticBorder;
          }
          gameborder_t::operator=(&gameinfo.Border,other);
        }
        else {
          FScanner::MustGetToken(&this->sc,0x104);
          gameinfo.Border.offset = (BYTE)(this->sc).Number;
          FScanner::MustGetToken(&this->sc,0x2c);
          FScanner::MustGetToken(&this->sc,0x104);
          gameinfo.Border.size = (BYTE)(this->sc).Number;
          for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
            FScanner::MustGetToken(&this->sc,0x2c);
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(*(FString **)((long)&DAT_007c9610 + lVar6),(this->sc).String);
          }
        }
      }
      else {
        iVar2 = strcasecmp(__s1.Chars,"armoricons");
        if (iVar2 == 0) {
          FScanner::MustGetToken(&this->sc,0x102);
          FString::operator=(&gameinfo.ArmorIcon1,(this->sc).String);
          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
          if (!bVar1) goto LAB_00463e20;
          FScanner::MustGetToken(&this->sc,0x106);
          gameinfo.Armor2Percent = (this->sc).Float;
          FScanner::MustGetToken(&this->sc,0x2c);
          FScanner::MustGetToken(&this->sc,0x102);
          this_00 = &gameinfo.ArmorIcon2;
        }
        else {
          iVar2 = strcasecmp(__s1.Chars,"maparrow");
          if (iVar2 == 0) {
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(&gameinfo.mMapArrow,(this->sc).String);
            bVar1 = FScanner::CheckToken(&this->sc,0x2c);
            if (!bVar1) {
              FString::operator=(&gameinfo.mCheatMapArrow,(char *)"");
              goto LAB_00463e20;
            }
            FScanner::MustGetToken(&this->sc,0x102);
            this_00 = &gameinfo.mCheatMapArrow;
          }
          else {
            iVar2 = strcasecmp(__s1.Chars,"cheatKey");
            if (iVar2 == 0) {
              FScanner::MustGetToken(&this->sc,0x102);
              this_00 = &gameinfo.mCheatKey;
            }
            else {
              iVar2 = strcasecmp(__s1.Chars,"easyKey");
              if (iVar2 == 0) {
                FScanner::MustGetToken(&this->sc,0x102);
                this_00 = &gameinfo.mEasyKey;
              }
              else {
                iVar2 = strcasecmp(__s1.Chars,"titlePage");
                if (iVar2 != 0) {
                  iVar2 = strcasecmp(__s1.Chars,"addcreditPage");
                  if (iVar2 == 0) {
                    do {
                      FScanner::MustGetToken(&this->sc,0x102);
                      pcVar7 = (this->sc).String;
                      sVar4 = strlen(pcVar7);
                      if (8 < sVar4) {
                        FScanner::ScriptError
                                  (&this->sc,
                                   "Value for \'%s\' can not be longer than %d characters.",
                                   "creditPages",8);
                        pcVar7 = (this->sc).String;
                      }
                      uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.creditPages,1);
                      FName::operator=(gameinfo.creditPages.Array + uVar3,pcVar7);
                      bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                    } while (bVar1);
                  }
                  else {
                    iVar2 = strcasecmp(__s1.Chars,"CreditPage");
                    if (iVar2 == 0) {
                      TArray<FName,_FName>::Clear(&gameinfo.creditPages);
                      do {
                        FScanner::MustGetToken(&this->sc,0x102);
                        pcVar7 = (this->sc).String;
                        sVar4 = strlen(pcVar7);
                        if (8 < sVar4) {
                          FScanner::ScriptError
                                    (&this->sc,
                                     "Value for \'%s\' can not be longer than %d characters.",
                                     "creditPages",8);
                          pcVar7 = (this->sc).String;
                        }
                        uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.creditPages,1);
                        FName::operator=(gameinfo.creditPages.Array + uVar3,pcVar7);
                        bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                      } while (bVar1);
                    }
                    else {
                      iVar2 = strcasecmp(__s1.Chars,"addplayerclasses");
                      if (iVar2 == 0) {
                        do {
                          FScanner::MustGetToken(&this->sc,0x102);
                          pcVar7 = (this->sc).String;
                          uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.PlayerClasses,1);
                          FName::operator=(gameinfo.PlayerClasses.Array + uVar3,pcVar7);
                          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                        } while (bVar1);
                      }
                      else {
                        iVar2 = strcasecmp(__s1.Chars,"playerclasses");
                        if (iVar2 == 0) {
                          TArray<FName,_FName>::Clear(&gameinfo.PlayerClasses);
                          do {
                            FScanner::MustGetToken(&this->sc,0x102);
                            pcVar7 = (this->sc).String;
                            uVar3 = TArray<FName,_FName>::Reserve(&gameinfo.PlayerClasses,1);
                            FName::operator=(gameinfo.PlayerClasses.Array + uVar3,pcVar7);
                            bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                          } while (bVar1);
                        }
                        else {
                          iVar2 = strcasecmp(__s1.Chars,"titleMusic");
                          if (iVar2 == 0) {
                            FScanner::MustGetToken(&this->sc,0x102);
                            gameinfo.titleOrder = 0;
                            pcVar7 = (this->sc).String;
                            pcVar5 = strchr(pcVar7,0x3a);
                            if (pcVar5 != (char *)0x0) {
                              gameinfo.titleOrder = atoi(pcVar5 + 1);
                              *pcVar5 = '\0';
                              pcVar7 = (this->sc).String;
                            }
                            FString::operator=(&gameinfo.titleMusic,pcVar7);
                          }
                          else {
                            iVar2 = strcasecmp(__s1.Chars,"titleTime");
                            if (iVar2 == 0) {
                              FScanner::MustGetFloat(&this->sc);
                              gameinfo.titleTime = (float)(this->sc).Float;
                            }
                            else {
                              iVar2 = strcasecmp(__s1.Chars,"advisoryTime");
                              if (iVar2 == 0) {
                                FScanner::MustGetFloat(&this->sc);
                                gameinfo.advisoryTime = (float)(this->sc).Float;
                              }
                              else {
                                iVar2 = strcasecmp(__s1.Chars,"pageTime");
                                if (iVar2 == 0) {
                                  FScanner::MustGetFloat(&this->sc);
                                  gameinfo.pageTime = (float)(this->sc).Float;
                                }
                                else {
                                  iVar2 = strcasecmp(__s1.Chars,"chatSound");
                                  if (iVar2 == 0) {
                                    FScanner::MustGetToken(&this->sc,0x102);
                                    this_00 = &gameinfo.chatSound;
                                    goto LAB_00463e18;
                                  }
                                  iVar2 = strcasecmp(__s1.Chars,"finaleMusic");
                                  if (iVar2 == 0) {
                                    FScanner::MustGetToken(&this->sc,0x102);
                                    gameinfo.finaleOrder = 0;
                                    pcVar7 = (this->sc).String;
                                    pcVar5 = strchr(pcVar7,0x3a);
                                    if (pcVar5 != (char *)0x0) {
                                      gameinfo.finaleOrder = atoi(pcVar5 + 1);
                                      *pcVar5 = '\0';
                                      pcVar7 = (this->sc).String;
                                    }
                                    FString::operator=(&gameinfo.finaleMusic,pcVar7);
                                  }
                                  else {
                                    iVar2 = strcasecmp(__s1.Chars,"finaleFlat");
                                    if (iVar2 == 0) {
                                      FScanner::MustGetToken(&this->sc,0x102);
                                      this_00 = &gameinfo.FinaleFlat;
                                      goto LAB_00463e18;
                                    }
                                    iVar2 = strcasecmp(__s1.Chars,"finalePage");
                                    if (iVar2 == 0) {
                                      TArray<FName,_FName>::Clear(&gameinfo.finalePages);
                                      do {
                                        FScanner::MustGetToken(&this->sc,0x102);
                                        pcVar7 = (this->sc).String;
                                        sVar4 = strlen(pcVar7);
                                        if (8 < sVar4) {
                                          FScanner::ScriptError
                                                    (&this->sc,
                                                                                                          
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"finalePages",8);
                                          pcVar7 = (this->sc).String;
                                        }
                                        uVar3 = TArray<FName,_FName>::Reserve
                                                          (&gameinfo.finalePages,1);
                                        FName::operator=(gameinfo.finalePages.Array + uVar3,pcVar7);
                                        bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                      } while (bVar1);
                                    }
                                    else {
                                      iVar2 = strcasecmp(__s1.Chars,"addinfoPage");
                                      if (iVar2 == 0) {
                                        do {
                                          FScanner::MustGetToken(&this->sc,0x102);
                                          pcVar7 = (this->sc).String;
                                          sVar4 = strlen(pcVar7);
                                          if (8 < sVar4) {
                                            FScanner::ScriptError
                                                      (&this->sc,
                                                                                                              
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                            pcVar7 = (this->sc).String;
                                          }
                                          uVar3 = TArray<FName,_FName>::Reserve
                                                            (&gameinfo.infoPages,1);
                                          FName::operator=(gameinfo.infoPages.Array + uVar3,pcVar7);
                                          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                        } while (bVar1);
                                      }
                                      else {
                                        iVar2 = strcasecmp(__s1.Chars,"infoPage");
                                        if (iVar2 != 0) {
                                          iVar2 = strcasecmp(__s1.Chars,"pausesign");
                                          if (iVar2 == 0) {
                                            FScanner::MustGetToken(&this->sc,0x102);
                                            this_00 = &gameinfo.PauseSign;
                                          }
                                          else {
                                            iVar2 = strcasecmp(__s1.Chars,"quitSound");
                                            if (iVar2 == 0) {
                                              FScanner::MustGetToken(&this->sc,0x102);
                                              this_00 = &gameinfo.quitSound;
                                            }
                                            else {
                                              iVar2 = strcasecmp(__s1.Chars,"borderFlat");
                                              if (iVar2 != 0) {
                                                iVar2 = strcasecmp(__s1.Chars,"telefogheight");
                                                if (iVar2 == 0) {
                                                  FScanner::MustGetFloat(&this->sc);
                                                  gameinfo.telefogheight = (this->sc).Float;
                                                }
                                                else {
                                                  iVar2 = strcasecmp(__s1.Chars,"gibfactor");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetFloat(&this->sc);
                                                    gameinfo.gibfactor = (this->sc).Float;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,"defKickback");
                                                    if (iVar2 != 0) {
                                                      iVar2 = strcasecmp(__s1.Chars,"SkyFlatName");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        this_00 = &gameinfo.SkyFlatName;
                                                      }
                                                      else {
                                                        iVar2 = strcasecmp(__s1.Chars,"translator");
                                                        if (iVar2 != 0) {
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "pickupcolor");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            FString::FString(&color,(this->sc).
                                                                                    String);
                                                            V_GetColorStringByName
                                                                      ((char *)&colorName);
                                                            if (*(int *)(colorName.Chars + -0xc) !=
                                                                0) {
                                                              FString::operator=(&color,&colorName);
                                                            }
                                                            gameinfo.pickupcolor =
                                                                 V_GetColorFromString
                                                                           ((DWORD *)0x0,color.Chars
                                                                           );
                                                          }
                                                          else {
                                                            iVar2 = strcasecmp(__s1.Chars,
                                                                               "defaultbloodcolor");
                                                            if (iVar2 == 0) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              FString::FString(&color,(this->sc).
                                                                                      String);
                                                              V_GetColorStringByName
                                                                        ((char *)&colorName);
                                                              if (*(int *)(colorName.Chars + -0xc)
                                                                  != 0) {
                                                                FString::operator=(&color,&colorName
                                                                                  );
                                                              }
                                                              gameinfo.defaultbloodcolor =
                                                                   V_GetColorFromString
                                                                             ((DWORD *)0x0,
                                                                              color.Chars);
                                                            }
                                                            else {
                                                              iVar2 = strcasecmp(__s1.Chars,
                                                                                                                                                                  
                                                  "defaultbloodparticlecolor");
                                                  if (iVar2 != 0) {
                                                    iVar2 = strcasecmp(__s1.Chars,"backpacktype");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      this_00 = &gameinfo.backpacktype;
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,"statusbar");
                                                      if (iVar2 != 0) {
                                                        iVar2 = strcasecmp(__s1.Chars,
                                                                           "intermissionMusic");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          gameinfo.intermissionOrder = 0;
                                                          pcVar7 = (this->sc).String;
                                                          pcVar5 = strchr(pcVar7,0x3a);
                                                          if (pcVar5 != (char *)0x0) {
                                                            gameinfo.intermissionOrder =
                                                                 atoi(pcVar5 + 1);
                                                            *pcVar5 = '\0';
                                                            pcVar7 = (this->sc).String;
                                                          }
                                                          FString::operator=(&gameinfo.
                                                  intermissionMusic,pcVar7);
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,"CursorPic");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      this_00 = &gameinfo.CursorPic;
                                                      goto LAB_00463e18;
                                                    }
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "noloopfinalemusic");
                                                    if (iVar2 == 0) {
                                                      bVar1 = FScanner::CheckToken(&this->sc,0x14c);
                                                      if (bVar1) {
                                                        gameinfo.noloopfinalemusic = false;
                                                      }
                                                      else {
                                                        FScanner::MustGetToken(&this->sc,0x14b);
                                                        gameinfo.noloopfinalemusic = true;
                                                      }
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,"drawreadthis");
                                                      if (iVar2 == 0) {
                                                        bVar1 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (bVar1) {
                                                          gameinfo.drawreadthis = false;
                                                        }
                                                        else {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                          gameinfo.drawreadthis = true;
                                                        }
                                                      }
                                                      else {
                                                        iVar2 = strcasecmp(__s1.Chars,"swapmenu");
                                                        if (iVar2 == 0) {
                                                          bVar1 = FScanner::CheckToken
                                                                            (&this->sc,0x14c);
                                                          if (bVar1) {
                                                            gameinfo.swapmenu = false;
                                                          }
                                                          else {
                                                            FScanner::MustGetToken(&this->sc,0x14b);
                                                            gameinfo.swapmenu = true;
                                                          }
                                                        }
                                                        else {
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "dontcrunchcorpses");
                                                          if (iVar2 == 0) {
                                                            bVar1 = FScanner::CheckToken
                                                                              (&this->sc,0x14c);
                                                            if (bVar1) {
                                                              gameinfo.dontcrunchcorpses = false;
                                                            }
                                                            else {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x14b);
                                                              gameinfo.dontcrunchcorpses = true;
                                                            }
                                                          }
                                                          else {
                                                            iVar2 = strcasecmp(__s1.Chars,
                                                                               "intermissioncounter"
                                                                              );
                                                            if (iVar2 == 0) {
                                                              bVar1 = FScanner::CheckToken
                                                                                (&this->sc,0x14c);
                                                              if (bVar1) {
                                                                gameinfo.intermissioncounter = false
                                                                ;
                                                              }
                                                              else {
                                                                FScanner::MustGetToken
                                                                          (&this->sc,0x14b);
                                                                gameinfo.intermissioncounter = true;
                                                              }
                                                            }
                                                            else {
                                                              iVar2 = strcasecmp(__s1.Chars,
                                                                                 "nightmarefast");
                                                              if (iVar2 == 0) {
                                                                bVar1 = FScanner::CheckToken
                                                                                  (&this->sc,0x14c);
                                                                if (bVar1) {
                                                                  gameinfo.nightmarefast = false;
                                                                }
                                                                else {
                                                                  FScanner::MustGetToken
                                                                            (&this->sc,0x14b);
                                                                  gameinfo.nightmarefast = true;
                                                                }
                                                              }
                                                              else {
                                                                iVar2 = strcasecmp(__s1.Chars,
                                                                                   "dimcolor");
                                                                if (iVar2 == 0) {
                                                                  FScanner::MustGetToken
                                                                            (&this->sc,0x102);
                                                                  FString::FString(&color,(this->sc)
                                                                                          .String);
                                                                  V_GetColorStringByName
                                                                            ((char *)&colorName);
                                                                  if (*(int *)(colorName.Chars +
                                                                              -0xc) != 0) {
                                                                    FString::operator=(&color,&
                                                  colorName);
                                                  }
                                                  gameinfo.dimcolor =
                                                       V_GetColorFromString
                                                                 ((DWORD *)0x0,color.Chars);
                                                  goto LAB_00464353;
                                                  }
                                                  iVar2 = strcasecmp(__s1.Chars,"dimamount");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetFloat(&this->sc);
                                                    gameinfo.dimamount = (float)(this->sc).Float;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "definventorymaxamount");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetNumber(&this->sc);
                                                      gameinfo.definventorymaxamount =
                                                           (this->sc).Number;
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,
                                                                         "defaultrespawntime");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetNumber(&this->sc);
                                                        gameinfo.defaultrespawntime =
                                                             (this->sc).Number;
                                                      }
                                                      else {
                                                        iVar2 = strcasecmp(__s1.Chars,
                                                                           "defaultdropstyle");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetNumber(&this->sc);
                                                          gameinfo.defaultdropstyle =
                                                               (this->sc).Number;
                                                        }
                                                        else {
                                                          iVar2 = strcasecmp(__s1.Chars,"endoom");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            this_00 = &gameinfo.Endoom;
                                                            goto LAB_00463e18;
                                                          }
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "addquitmessages");
                                                          if (iVar2 == 0) {
                                                            do {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              pcVar7 = (this->sc).String;
                                                              uVar3 = TArray<FString,_FString>::
                                                                      Reserve(&gameinfo.quitmessages
                                                                              ,1);
                                                              FString::operator=(gameinfo.
                                                  quitmessages.Array + uVar3,pcVar7);
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  } while (bVar1);
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,"quitmessages");
                                                    if (iVar2 == 0) {
                                                      TArray<FString,_FString>::Clear
                                                                (&gameinfo.quitmessages);
                                                      do {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        pcVar7 = (this->sc).String;
                                                        uVar3 = TArray<FString,_FString>::Reserve
                                                                          (&gameinfo.quitmessages,1)
                                                        ;
                                                        FString::operator=(gameinfo.quitmessages.
                                                                           Array + uVar3,pcVar7);
                                                        bVar1 = FScanner::CheckToken(&this->sc,0x2c)
                                                        ;
                                                      } while (bVar1);
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,
                                                                         "menufontcolor_title");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        this_01 = &gameinfo.mTitleColor;
                                                      }
                                                      else {
                                                        iVar2 = strcasecmp(__s1.Chars,
                                                                           "menufontcolor_label");
                                                        if (iVar2 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          this_01 = &gameinfo.mFontColor;
                                                        }
                                                        else {
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "menufontcolor_value");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            this_01 = &gameinfo.mFontColorValue;
                                                          }
                                                          else {
                                                            iVar2 = strcasecmp(__s1.Chars,
                                                                                                                                                              
                                                  "menufontcolor_action");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    this_01 = &gameinfo.mFontColorMore;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "menufontcolor_header");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      this_01 = &gameinfo.mFontColorHeader;
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,
                                                                         "menufontcolor_highlight");
                                                      if (iVar2 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        this_01 = &gameinfo.mFontColorHighlight;
                                                      }
                                                      else {
                                                        iVar2 = strcasecmp(__s1.Chars,
                                                                           "menufontcolor_selection"
                                                                          );
                                                        if (iVar2 != 0) {
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "menubackbutton");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            this_00 = &gameinfo.mBackButton;
                                                            goto LAB_00463e18;
                                                          }
                                                          iVar2 = strcasecmp(__s1.Chars,
                                                                             "textscreenx");
                                                          if (iVar2 == 0) {
                                                            FScanner::MustGetNumber(&this->sc);
                                                            gameinfo.TextScreenX = (this->sc).Number
                                                            ;
                                                          }
                                                          else {
                                                            iVar2 = strcasecmp(__s1.Chars,
                                                                               "textscreeny");
                                                            if (iVar2 == 0) {
                                                              FScanner::MustGetNumber(&this->sc);
                                                              gameinfo.TextScreenY =
                                                                   (this->sc).Number;
                                                            }
                                                            else {
                                                              iVar2 = strcasecmp(__s1.Chars,
                                                                                                                                                                  
                                                  "defaultendsequence");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    this_01 = &gameinfo.DefaultEndSequence;
                                                    goto LAB_00464751;
                                                  }
                                                  iVar2 = strcasecmp(__s1.Chars,
                                                                     "statscreen_mapnamefont");
                                                  if (iVar2 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    FName::operator=(&gameinfo.
                                                  mStatscreenMapNameFont.fontname,(this->sc).String)
                                                  ;
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    this_01 = &gameinfo.mStatscreenMapNameFont.color
                                                    ;
                                                    goto LAB_00464751;
                                                  }
                                                  gameinfo.mStatscreenMapNameFont.color.Index = 0;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "statscreen_finishedfont");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.fontname,(this->sc).String
                                                  );
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    this_01 = &gameinfo.mStatscreenFinishedFont.
                                                               color;
                                                    goto LAB_00464751;
                                                  }
                                                  gameinfo.mStatscreenFinishedFont.color.Index = 0;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "statscreen_enteringfont");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.fontname,(this->sc).String
                                                  );
                                                  bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                                  if (bVar1) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    this_01 = &gameinfo.mStatscreenEnteringFont.
                                                               color;
                                                    goto LAB_00464751;
                                                  }
                                                  gameinfo.mStatscreenEnteringFont.color.Index = 0;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "statscreen_finishedpatch");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenFinishedFont.fontname,(this->sc).String
                                                  );
                                                  gameinfo.mStatscreenFinishedFont.color.Index = 1;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "statscreen_enteringpatch");
                                                    if (iVar2 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      FName::operator=(&gameinfo.
                                                  mStatscreenEnteringFont.fontname,(this->sc).String
                                                  );
                                                  gameinfo.mStatscreenEnteringFont.color.Index = 1;
                                                  }
                                                  else {
                                                    iVar2 = strcasecmp(__s1.Chars,
                                                                       "norandomplayerclass");
                                                    if (iVar2 == 0) {
                                                      bVar1 = FScanner::CheckToken(&this->sc,0x14c);
                                                      if (bVar1) {
                                                        gameinfo.norandomplayerclass = false;
                                                      }
                                                      else {
                                                        FScanner::MustGetToken(&this->sc,0x14b);
                                                        gameinfo.norandomplayerclass = true;
                                                      }
                                                    }
                                                    else {
                                                      iVar2 = strcasecmp(__s1.Chars,
                                                                         "forcekillscripts");
                                                      if (iVar2 == 0) {
                                                        bVar1 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (bVar1) {
                                                          gameinfo.forcekillscripts = false;
                                                        }
                                                        else {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                          gameinfo.forcekillscripts = true;
                                                        }
                                                      }
                                                      else {
                                                        FScanner::UnGet(&this->sc);
                                                        SkipToNext(this);
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00463e20;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  this_01 = &gameinfo.mFontColorSelection;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
LAB_00464751:
                                                  FName::operator=(this_01,(this->sc).String);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00463e20;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  this_00 = &gameinfo.statusbar;
                                                  }
                                                  goto LAB_00463e18;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  FString::FString(&color,(this->sc).String);
                                                  V_GetColorStringByName((char *)&colorName);
                                                  if (*(int *)(colorName.Chars + -0xc) != 0) {
                                                    FString::operator=(&color,&colorName);
                                                  }
                                                  gameinfo.defaultbloodparticlecolor =
                                                       V_GetColorFromString
                                                                 ((DWORD *)0x0,color.Chars);
                                                  }
                                                  }
LAB_00464353:
                                                  FString::~FString(&colorName);
                                                  FString::~FString(&color);
                                                  goto LAB_00463e20;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  this_00 = &gameinfo.translator;
                                                  }
                                                  goto LAB_00463e18;
                                                  }
                                                  FScanner::MustGetNumber(&this->sc);
                                                  gameinfo.defKickback = (this->sc).Number;
                                                  }
                                                }
                                                goto LAB_00463e20;
                                              }
                                              FScanner::MustGetToken(&this->sc,0x102);
                                              this_00 = &gameinfo.BorderFlat;
                                            }
                                          }
                                          goto LAB_00463e18;
                                        }
                                        TArray<FName,_FName>::Clear(&gameinfo.infoPages);
                                        do {
                                          FScanner::MustGetToken(&this->sc,0x102);
                                          pcVar7 = (this->sc).String;
                                          sVar4 = strlen(pcVar7);
                                          if (8 < sVar4) {
                                            FScanner::ScriptError
                                                      (&this->sc,
                                                                                                              
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                            pcVar7 = (this->sc).String;
                                          }
                                          uVar3 = TArray<FName,_FName>::Reserve
                                                            (&gameinfo.infoPages,1);
                                          FName::operator=(gameinfo.infoPages.Array + uVar3,pcVar7);
                                          bVar1 = FScanner::CheckToken(&this->sc,0x2c);
                                        } while (bVar1);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_00463e20;
                }
                FScanner::MustGetToken(&this->sc,0x102);
                this_00 = &gameinfo.TitlePage;
              }
            }
          }
        }
LAB_00463e18:
        FString::operator=(this_00,(this->sc).String);
      }
    }
LAB_00463e20:
    FString::~FString(&nextKey);
  } while( true );
}

Assistant:

void FMapInfoParser::ParseGameInfo()
{
	sc.MustGetToken('{');
	while(sc.GetToken())
	{
		if (sc.TokenType == '}') return;

		sc.TokenMustBe(TK_Identifier);
		FString nextKey = sc.String;
		sc.MustGetToken('=');

		if (nextKey.CompareNoCase("weaponslot") == 0)
		{
			sc.MustGetToken(TK_IntConst);
			if (sc.Number < 0 || sc.Number >= 10)
			{
				sc.ScriptError("Weapon slot index must be in range [0..9].\n");
			}
			int i = sc.Number;
			gameinfo.DefaultWeaponSlots[i].Clear();
			sc.MustGetToken(',');
			do
			{
				sc.MustGetString();
				FName val = sc.String;
				gameinfo.DefaultWeaponSlots[i].Push(val);

			}
			while (sc.CheckToken(','));
		}
		else if(nextKey.CompareNoCase("border") == 0)
		{
			staticgameborder_t *b;
			if (sc.CheckToken(TK_Identifier))
			{
				switch(sc.MustMatchString(GameInfoBorders))
				{
					default:
						b = &DoomBorder;
						break;
					case 1:
						b = &HereticBorder;
						break;
					case 2:
						b = &StrifeBorder;
						break;
				}
				gameinfo.Border = *b;
			}
			else
			{
				// border = {size, offset, tr, t, tl, r, l ,br, b, bl};
				FString *graphics[8] = { &gameinfo.Border.tr, &gameinfo.Border.t, &gameinfo.Border.tl, &gameinfo.Border.r, &gameinfo.Border.l, &gameinfo.Border.br, &gameinfo.Border.b, &gameinfo.Border.bl };
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.offset = sc.Number;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.size = sc.Number;
				for(int i = 0;i < 8;i++)
				{
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					(*graphics[i]) = sc.String;
				}
			}
		}
		else if(nextKey.CompareNoCase("armoricons") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.ArmorIcon1 = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_FloatConst);
				gameinfo.Armor2Percent = sc.Float;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_StringConst);
				gameinfo.ArmorIcon2 = sc.String;
			}
		}
		else if(nextKey.CompareNoCase("maparrow") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.mMapArrow = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_StringConst);
				gameinfo.mCheatMapArrow = sc.String;
			}
			else gameinfo.mCheatMapArrow = "";
		}
		// Insert valid keys here.
		GAMEINFOKEY_STRING(mCheatKey, "cheatKey")
		GAMEINFOKEY_STRING(mEasyKey, "easyKey")
		GAMEINFOKEY_STRING(TitlePage, "titlePage")
		GAMEINFOKEY_STRINGARRAY(creditPages, "addcreditPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(creditPages, "CreditPage", 8, true)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "addplayerclasses", 0, false)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "playerclasses", 0, true)
		GAMEINFOKEY_MUSIC(titleMusic, titleOrder, "titleMusic")
		GAMEINFOKEY_FLOAT(titleTime, "titleTime")
		GAMEINFOKEY_FLOAT(advisoryTime, "advisoryTime")
		GAMEINFOKEY_FLOAT(pageTime, "pageTime")
		GAMEINFOKEY_STRING(chatSound, "chatSound")
		GAMEINFOKEY_MUSIC(finaleMusic, finaleOrder, "finaleMusic")
		GAMEINFOKEY_STRING(FinaleFlat, "finaleFlat")
		GAMEINFOKEY_STRINGARRAY(finalePages, "finalePage", 8, true)
		GAMEINFOKEY_STRINGARRAY(infoPages, "addinfoPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(infoPages, "infoPage", 8, true)
		GAMEINFOKEY_STRING(PauseSign, "pausesign")
		GAMEINFOKEY_STRING(quitSound, "quitSound")
		GAMEINFOKEY_STRING(BorderFlat, "borderFlat")
		GAMEINFOKEY_DOUBLE(telefogheight, "telefogheight")
		GAMEINFOKEY_DOUBLE(gibfactor, "gibfactor")
		GAMEINFOKEY_INT(defKickback, "defKickback")
		GAMEINFOKEY_STRING(SkyFlatName, "SkyFlatName")
		GAMEINFOKEY_STRING(translator, "translator")
		GAMEINFOKEY_COLOR(pickupcolor, "pickupcolor")
		GAMEINFOKEY_COLOR(defaultbloodcolor, "defaultbloodcolor")
		GAMEINFOKEY_COLOR(defaultbloodparticlecolor, "defaultbloodparticlecolor")
		GAMEINFOKEY_STRING(backpacktype, "backpacktype")
		GAMEINFOKEY_STRING(statusbar, "statusbar")
		GAMEINFOKEY_MUSIC(intermissionMusic, intermissionOrder, "intermissionMusic")
		GAMEINFOKEY_STRING(CursorPic, "CursorPic")
		GAMEINFOKEY_BOOL(noloopfinalemusic, "noloopfinalemusic")
		GAMEINFOKEY_BOOL(drawreadthis, "drawreadthis")
		GAMEINFOKEY_BOOL(swapmenu, "swapmenu")
		GAMEINFOKEY_BOOL(dontcrunchcorpses, "dontcrunchcorpses")
		GAMEINFOKEY_BOOL(intermissioncounter, "intermissioncounter")
		GAMEINFOKEY_BOOL(nightmarefast, "nightmarefast")
		GAMEINFOKEY_COLOR(dimcolor, "dimcolor")
		GAMEINFOKEY_FLOAT(dimamount, "dimamount")
		GAMEINFOKEY_INT(definventorymaxamount, "definventorymaxamount")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultdropstyle, "defaultdropstyle")
		GAMEINFOKEY_STRING(Endoom, "endoom")
		GAMEINFOKEY_STRINGARRAY(quitmessages, "addquitmessages", 0, false)
		GAMEINFOKEY_STRINGARRAY(quitmessages, "quitmessages", 0, true)
		GAMEINFOKEY_STRING(mTitleColor, "menufontcolor_title")
		GAMEINFOKEY_STRING(mFontColor, "menufontcolor_label")
		GAMEINFOKEY_STRING(mFontColorValue, "menufontcolor_value")
		GAMEINFOKEY_STRING(mFontColorMore, "menufontcolor_action")
		GAMEINFOKEY_STRING(mFontColorHeader, "menufontcolor_header")
		GAMEINFOKEY_STRING(mFontColorHighlight, "menufontcolor_highlight")
		GAMEINFOKEY_STRING(mFontColorSelection, "menufontcolor_selection")
		GAMEINFOKEY_STRING(mBackButton, "menubackbutton")
		GAMEINFOKEY_INT(TextScreenX, "textscreenx")
		GAMEINFOKEY_INT(TextScreenY, "textscreeny")
		GAMEINFOKEY_STRING(DefaultEndSequence, "defaultendsequence")
		GAMEINFOKEY_FONT(mStatscreenMapNameFont, "statscreen_mapnamefont")
		GAMEINFOKEY_FONT(mStatscreenFinishedFont, "statscreen_finishedfont")
		GAMEINFOKEY_FONT(mStatscreenEnteringFont, "statscreen_enteringfont")
		GAMEINFOKEY_PATCH(mStatscreenFinishedFont, "statscreen_finishedpatch")
		GAMEINFOKEY_PATCH(mStatscreenEnteringFont, "statscreen_enteringpatch")
		GAMEINFOKEY_BOOL(norandomplayerclass, "norandomplayerclass")
		GAMEINFOKEY_BOOL(forcekillscripts, "forcekillscripts") // [JM] Force kill scripts on thing death. (MF7_NOKILLSCRIPTS overrides.)

		else
		{
			// ignore unkown keys.
			sc.UnGet();
			SkipToNext();
		}
	}